

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O2

void LineContext::testParseCpp(void)

{
  char cVar1;
  QDebug *pQVar2;
  qint64 t;
  QByteArray PARSE_CPP_FILE;
  LineContext context;
  QElapsedTimer timer;
  QDebug QStack_78;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  LineContext local_38;
  undefined8 local_18;
  undefined8 local_10;
  
  qgetenv((char *)&local_70);
  cVar1 = QByteArray::isNull();
  if (cVar1 == '\0') {
    LineContext(&local_38);
    local_18 = 0x8000000000000000;
    local_10 = 0x8000000000000000;
    QElapsedTimer::start();
    QString::fromUtf8<void>((QString *)&local_58,(QByteArray *)&local_70);
    init(&local_38,(EVP_PKEY_CTX *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_40 = "default";
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&QStack_78,"context.init cpp");
    t = QElapsedTimer::elapsed();
    pQVar2 = QDebug::operator<<(pQVar2,t);
    QDebug::operator<<(pQVar2,"ms");
    QDebug::~QDebug(&QStack_78);
    dump(&local_38);
    QArrayDataPointer<LineContextItem>::~QArrayDataPointer(&local_38.mContext.d);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  return;
}

Assistant:

void LineContext::testParseCpp()
{
    auto PARSE_CPP_FILE = qgetenv("PARSE_CPP_FILE");
    if (PARSE_CPP_FILE.isNull()) {
        return;
    }
    LineContext context;
    QElapsedTimer timer;
    timer.start();
    context.init(QString::fromUtf8(PARSE_CPP_FILE));
    qDebug() << "context.init cpp" << timer.elapsed() << "ms";
    context.dump();
}